

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

void __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::process_expired_timers<timertt::details::thread_unsafe_manager_mixin::lock_guard>
          (timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           *this,lock_guard *lock)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  while( true ) {
    if (this->m_current_tick_processed == false) {
      process_current_wheel_position<timertt::details::thread_unsafe_manager_mixin::lock_guard>
                (this,lock);
      uVar2 = this->m_current_position + 1;
      if (this->m_wheel_size <= uVar2) {
        uVar2 = 0;
      }
      this->m_current_position = uVar2;
      this->m_current_tick_processed = true;
    }
    lVar1 = (this->m_current_tick_border).__d.__r;
    if (lVar3 < lVar1) break;
    (this->m_current_tick_border).__d.__r = lVar1 + (this->m_granularity).__r;
    this->m_current_tick_processed = false;
  }
  return;
}

Assistant:

void
	process_expired_timers(
		//! Object's lock.
		UNIQUE_LOCK & lock )
	{
		/*
		 * NOTE: It is possible that period between consequtive
		 * calls to process_expired_timers will be longer than
		 * m_granuality (it is possible when engine is used inside
		 * timer_manager). In that case it is necessary to process
		 * several wheel positions at once.
		 */
		const auto now = monotonic_clock::now();
		for(;;)
		{
			if( !m_current_tick_processed )
			{
				process_current_wheel_position( lock );

				// After processing all current demands and rescheduling
				// all periodic demands the current_position must be
				// advanced.
				m_current_position += 1;
				if( m_current_position >= m_wheel_size )
					m_current_position = 0;

				m_current_tick_processed = true;
			}

			if( now >= m_current_tick_border )
			{
				// A switch to next tick is necessary.
				m_current_tick_border += m_granularity;
				m_current_tick_processed = false;
			}
			else
				break;
		}
	}